

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall HFactor::copyFrom(HFactor *this,HFactor *from)

{
  long in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000088;
  vector<double,_std::allocator<double>_> *in_stack_00000090;
  
  *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RSI + 0x20);
  *(undefined4 *)(in_RDI + 0x24) = *(undefined4 *)(in_RSI + 0x24);
  *(undefined8 *)(in_RDI + 0x28) = *(undefined8 *)(in_RSI + 0x28);
  *(undefined8 *)(in_RDI + 0x30) = *(undefined8 *)(in_RSI + 0x30);
  *(undefined8 *)(in_RDI + 0x38) = *(undefined8 *)(in_RSI + 0x38);
  *(undefined8 *)(in_RDI + 0x40) = *(undefined8 *)(in_RSI + 0x40);
  *(undefined4 *)(in_RDI + 0x48) = *(undefined4 *)(in_RSI + 0x48);
  *(undefined4 *)(in_RDI + 0x4c) = *(undefined4 *)(in_RSI + 0x4c);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  *(undefined4 *)(in_RDI + 0x3e0) = *(undefined4 *)(in_RSI + 0x3e0);
  *(undefined4 *)(in_RDI + 0x3e4) = *(undefined4 *)(in_RSI + 0x3e4);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  return;
}

Assistant:

void HFactor::copyFrom(const HFactor *from) {
    numRow = from->numRow;
    numCol = from->numCol;
    Astart = from->Astart;
    Aindex = from->Aindex;
    Avalue = from->Avalue;
    baseIndex = from->baseIndex;
    updateMethod = from->updateMethod;

    nwork = from->nwork;
    iwork = from->iwork;
    dwork = from->dwork;

    LpivotLookup = from->LpivotLookup;
    LpivotIndex = from->LpivotIndex;
    Lstart = from->Lstart;
    Lindex = from->Lindex;
    Lvalue = from->Lvalue;
    LRstart = from->LRstart;
    LRindex = from->LRindex;
    LRvalue = from->LRvalue;

    UpivotLookup = from->UpivotLookup;
    UpivotIndex = from->UpivotIndex;
    UpivotValue = from->UpivotValue;
    UmeritX = from->UmeritX;
    UtotalX = from->UtotalX;
    Ustart = from->Ustart;
    Ulastp = from->Ulastp;
    Uindex = from->Uindex;
    Uvalue = from->Uvalue;
    URstart = from->URstart;
    URlastp = from->URlastp;
    URspace = from->URspace;
    URindex = from->URindex;
    URvalue = from->URvalue;

    PFpivotValue = from->PFpivotValue;
    PFpivotIndex = from->PFpivotIndex;
    PFstart = from->PFstart;
    PFindex = from->PFindex;
    PFvalue = from->PFvalue;
}